

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2pkhAddressFromString_Test::TestBody
          (ElementsConfidentialAddress_P2pkhAddressFromString_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_c60;
  Message local_c58;
  AddressType local_c50 [2];
  undefined1 local_c48 [8];
  AssertionResult gtest_ar_11;
  Message local_c30;
  NetType local_c28 [2];
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_bf0;
  Message local_be8;
  string local_be0 [39];
  bool local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar__1;
  Message local_ba0;
  Address local_b98 [376];
  string local_a20 [32];
  undefined1 local_a00 [8];
  AssertionResult gtest_ar_9;
  Message local_9e8;
  ByteData local_9e0;
  string local_9c8 [32];
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_8;
  Message local_990;
  Pubkey local_988;
  string local_970 [32];
  undefined1 local_950 [8];
  AssertionResult gtest_ar_7;
  Message local_938;
  string local_930 [32];
  undefined1 local_910 [8];
  AssertionResult gtest_ar_6;
  Message local_8f8;
  allocator local_8e9;
  string local_8e8 [32];
  ElementsConfidentialAddress local_8c8 [432];
  AssertHelper local_718;
  Message local_710;
  AddressType local_708 [2];
  undefined1 local_700 [8];
  AssertionResult gtest_ar_5;
  Message local_6e8;
  NetType local_6e0 [2];
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_6a8;
  Message local_6a0;
  string local_698 [39];
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_;
  Message local_658;
  Address local_650 [376];
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_3;
  Message local_4a0;
  ByteData local_498;
  string local_480 [32];
  undefined1 local_460 [8];
  AssertionResult gtest_ar_2;
  Message local_448;
  Pubkey local_440;
  string local_428 [32];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  string local_3e8 [32];
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar;
  Message local_3b0;
  allocator local_3a1;
  string local_3a0 [32];
  ElementsConfidentialAddress local_380 [448];
  ElementsConfidentialAddress local_1c0 [8];
  ElementsConfidentialAddress address;
  ElementsConfidentialAddress_P2pkhAddressFromString_Test *this_local;
  
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3a0,
                 "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
                 &local_3a1);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_380,local_3a0);
      cfd::core::ElementsConfidentialAddress::operator=(local_1c0,local_380);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_380);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    }
  }
  else {
    testing::Message::Message(&local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x10b,
               "Expected: (address = ElementsConfidentialAddress( \"VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_3b0);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3c8,
             "\"VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w\"",
             "address.GetAddress().c_str()",
             "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
             pcVar3);
  std::__cxx11::string::~string(local_3e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x10e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_408,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar3);
  std::__cxx11::string::~string(local_428);
  cfd::core::Pubkey::~Pubkey(&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x111,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_460,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar3)
  ;
  std::__cxx11::string::~string(local_480);
  cfd::core::ByteData::~ByteData(&local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4b8,"\"QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",pcVar3);
  std::__cxx11::string::~string(local_4d8);
  cfd::core::Address::~Address(local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x115,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_698);
  local_671 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  std::__cxx11::string::~string(local_698);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_670,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x117,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6e0[1] = 3;
  local_6e0[0] = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_6d8,"ElementsNetType::kLiquidV1","address.GetNetType()",
             local_6e0 + 1,local_6e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_6e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  local_708[1] = 2;
  local_708[0] = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_700,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",local_708 + 1,local_708);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_700);
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x119,pcVar3);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_8e8,
                 "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
                 &local_8e9);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_8c8,local_8e8);
      cfd::core::ElementsConfidentialAddress::operator=(local_1c0,local_8c8);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_8c8);
      std::__cxx11::string::~string(local_8e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
    }
  }
  else {
    testing::Message::Message(&local_8f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x11e,
               "Expected: (address = ElementsConfidentialAddress( \"CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_8f8);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_910,
             "\"CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o\"",
             "address.GetAddress().c_str()",
             "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
             pcVar3);
  std::__cxx11::string::~string(local_930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar1) {
    testing::Message::Message(&local_938);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x121,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_950,
             "\"02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16\"",
             "address.GetConfidentialKey().GetHex().c_str()",
             "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",pcVar3);
  std::__cxx11::string::~string(local_970);
  cfd::core::Pubkey::~Pubkey(&local_988);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar1) {
    testing::Message::Message(&local_990);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_990);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  cfd::core::ElementsConfidentialAddress::GetHash();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9a8,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",pcVar3)
  ;
  std::__cxx11::string::~string(local_9c8);
  cfd::core::ByteData::~ByteData(&local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a00,"\"2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3\"",
             "address.GetUnblindedAddress().GetAddress().c_str()",
             "2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",pcVar3);
  std::__cxx11::string::~string(local_a20);
  cfd::core::Address::~Address(local_b98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    testing::Message::Message(&local_ba0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_();
  bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_be0);
  local_bb9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb8,&local_bb9,(type *)0x0);
  std::__cxx11::string::~string(local_be0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_be8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_bb8,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress())","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x12a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_bf0,&local_be8);
    testing::internal::AssertHelper::~AssertHelper(&local_bf0);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  local_c28[1] = 4;
  local_c28[0] = cfd::core::ElementsConfidentialAddress::GetNetType();
  testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
            ((EqHelper<false> *)local_c20,"ElementsNetType::kElementsRegtest","address.GetNetType()"
             ,local_c28 + 1,local_c28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
  if (!bVar1) {
    testing::Message::Message(&local_c30);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,299,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
  local_c50[1] = 2;
  local_c50[0] = cfd::core::ElementsConfidentialAddress::GetAddressType();
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_c48,"ElementsAddressType::kP2pkhAddress",
             "address.GetAddressType()",local_c50 + 1,local_c50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c48);
  if (!bVar1) {
    testing::Message::Message(&local_c58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c48);
    testing::internal::AssertHelper::AssertHelper
              (&local_c60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,300,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c60,&local_c58);
    testing::internal::AssertHelper::~AssertHelper(&local_c60);
    testing::Message::~Message(&local_c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c48);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(local_1c0);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2pkhAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w")));
  EXPECT_STREQ(
      "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o")));
  EXPECT_STREQ(
      "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
}